

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.cpp
# Opt level: O0

void pstore::threads::set_name(not_null<const_char_*> name)

{
  pthread_t __target_thread;
  char *__name;
  errno_erc local_18;
  int local_14;
  not_null<const_char_*> nStack_10;
  int err;
  not_null<const_char_*> name_local;
  
  local_14 = 0;
  nStack_10.ptr_ = name.ptr_;
  __target_thread = pthread_self();
  __name = pstore::gsl::not_null::operator_cast_to_char_((not_null *)&stack0xfffffffffffffff0);
  local_14 = pthread_setname_np(__target_thread,__name);
  if (local_14 != 0) {
    errno_erc::errno_erc(&local_18,local_14);
    raise<pstore::errno_erc,char[18]>(local_18,(char (*) [18])"threads::set_name");
  }
  return;
}

Assistant:

void set_name (gsl::not_null<gsl::czstring> const name) {
            // pthread support for setting thread names comes in various non-portable forms.
            // Here I'm supporting four versions:
            // - the single argument version used by macOS.
            // - two argument form supported by Linux.
            // - three argument form supported by NetBSD.
            // - the slightly differently named form used in FreeBSD.
            int err = 0;
#    if USE_FALLBACK
            std::strncpy (thread_name, name, name_size);
            thread_name[name_size - 1] = '\0';
#    elif defined(PSTORE_PTHREAD_SETNAME_NP_1_ARG)
            err = pthread_setname_np (name);
#    elif defined(PSTORE_PTHREAD_SETNAME_NP_2_ARGS)
            err = pthread_setname_np (pthread_self (), name);
#    elif defined(PSTORE_PTHREAD_SETNAME_NP_3_ARGS)
            err = pthread_setname_np (pthread_self (), name, nullptr);
#    elif defined(PSTORE_PTHREAD_SET_NAME_NP)
            pthread_set_name_np (pthread_self (), name);
#    else
#        error "Don't know how to set the name of the current thread"
#    endif
            if (err != 0) {
                raise (errno_erc{err}, "threads::set_name");
            }
        }